

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O0

void __thiscall Clause::resize(Clause *this,uint newSize)

{
  int *data4;
  int *data3;
  float *data2;
  uint newSize_local;
  Clause *this_local;
  
  if (((ulong)*this & 1) != 0) {
    this->data[newSize].x = this->data[*(uint *)this >> 8].x;
    this->data[newSize + 1].x = this->data[(int)((*(uint *)this >> 8) + 1)].x;
    this->data[newSize + 2].x = this->data[(int)((*(uint *)this >> 8) + 2)].x;
  }
  *(uint *)this = *(uint *)this & 0xff | newSize << 8;
  return;
}

Assistant:

void resize(unsigned int newSize) {
		// Careful of the order of operations here: don't overwrite sz
		// with newSize until we've copied the activities, and make sure
		// you copy data2 before data3 in case one would overwrite the
		// other.
		auto* data2 = (float*)data;
		int* data3 = (int*)data;
		int* data4 = (int*)data;
		if (learnt) {
			data2[newSize] = data2[sz];
			data3[newSize + 1] = data3[sz + 1];
			data4[newSize + 2] = data4[sz + 2];
		}
		sz = newSize;
	}